

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O1

JSONObject * __thiscall
Js::JSONStringifier::ReadObject
          (JSONStringifier *this,RecyclableObject *obj,JSONObjectStack *objectStack)

{
  uint uVar1;
  Recycler *this_00;
  ScriptContext *pSVar2;
  code *pcVar3;
  undefined1 auVar4 [8];
  charcount_t cVar5;
  bool bVar6;
  int iVar7;
  uint32 numericIndex;
  JSONObjectStack *pJVar8;
  Recycler *alloc;
  SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *this_01;
  undefined4 *puVar9;
  Type *pTVar10;
  JavascriptProxy *proxyObject;
  EnumeratorCache *pEVar11;
  JavascriptString *propertyString;
  undefined1 auStack_b8 [8];
  TrackAllocData data;
  undefined1 auStack_68 [8];
  JSONObjectStack stack;
  PropertyId local_3c;
  ScriptContext *pSStack_38;
  PropertyId nextKey;
  PropertyRecord *propertyRecord;
  
  pJVar8 = objectStack;
  if (objectStack->object != obj) {
    do {
      pJVar8 = pJVar8->next;
      if (pJVar8 == (JSONObjectStack *)0x0) goto LAB_00b763f4;
    } while (pJVar8->object != obj);
    if (pJVar8 == (JSONObjectStack *)0x0) {
LAB_00b763f4:
      stack.next._4_4_ = this->indentLength;
      uVar1 = this->gapLength;
      auStack_68 = (undefined1  [8])obj;
      stack.object = (RecyclableObject *)objectStack;
      if (uVar1 != 0) {
        if (CARRY4(uVar1,stack.next._4_4_)) {
          ::Math::DefaultOverflowPolicy();
        }
        this->indentLength = uVar1 + stack.next._4_4_;
      }
      this_00 = this->scriptContext->recycler;
      auStack_b8 = (undefined1  [8])&SListCounted<Js::JSONObjectProperty,Memory::Recycler>::typeinfo
      ;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_6a42cdd;
      data.filename._0_4_ = 0x23a;
      alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)auStack_b8);
      this_01 = (SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount> *)
                new<Memory::Recycler>(0x18,alloc,0x38bbb2);
      this_01->super_SListNodeBase<Memory::Recycler> = (Type)0x0;
      (this_01->super_RealCount).count = 0;
      Memory::Recycler::WBSetBit((char *)this_01);
      this_01->super_SListNodeBase<Memory::Recycler> = (SListNodeBase<Memory::Recycler>)this_01;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(this_01);
      (this_01->super_RealCount).count = 0;
      this_01[1].super_SListNodeBase<Memory::Recycler> = (SListNodeBase<Memory::Recycler>)this_00;
      pSVar2 = (ScriptContext *)this->propertyList;
      if (pSVar2 == (ScriptContext *)0x0) {
        bVar6 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
        if (bVar6) {
          proxyObject = UnsafeVarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj);
        }
        else {
          proxyObject = (JavascriptProxy *)0x0;
        }
        if (proxyObject == (JavascriptProxy *)0x0) {
          auStack_b8 = (undefined1  [8])0x0;
          data.typeinfo = (type_info *)0x0;
          data.plusSize = 0;
          data.line = 0;
          data._36_4_ = 0;
          JavascriptStaticEnumerator::Clear
                    ((JavascriptStaticEnumerator *)auStack_b8,None,(ScriptContext *)0x0);
          pEVar11 = JavascriptLibrary::GetStringifyCache
                              ((this->scriptContext->super_ScriptContextBase).javascriptLibrary,
                               (obj->type).ptr);
          iVar7 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x2b])
                            (obj,(JavascriptStaticEnumerator *)auStack_b8,0x1c,this->scriptContext,
                             pEVar11);
          if (iVar7 != 0) {
            local_3c = -1;
            propertyString =
                 JavascriptStaticEnumerator::MoveAndGetNext
                           ((JavascriptStaticEnumerator *)auStack_b8,&local_3c,
                            (PropertyAttributes *)0x0);
            if (propertyString != (JavascriptString *)0x0) {
              do {
                numericIndex = JavascriptStaticEnumerator::GetCurrentItemIndex
                                         ((JavascriptStaticEnumerator *)auStack_b8);
                if (numericIndex == 0xffffffff) {
                  pSStack_38 = (ScriptContext *)0x0;
                  if (local_3c == -1) {
                    ScriptContext::GetOrAddPropertyRecord
                              (this->scriptContext,propertyString,
                               (PropertyRecord **)&stack0xffffffffffffffc8);
                    local_3c = *(PropertyId *)
                                &(pSStack_38->super_ScriptContextBase).javascriptLibrary;
                  }
                  ReadObjectElement(this,propertyString,(PropertyRecord *)pSStack_38,obj,
                                    (JSONObject *)this_01,(JSONObjectStack *)auStack_68);
                }
                else {
                  ReadObjectElement(this,propertyString,numericIndex,obj,(JSONObject *)this_01,
                                    (JSONObjectStack *)auStack_68);
                }
                propertyString =
                     JavascriptStaticEnumerator::MoveAndGetNext
                               ((JavascriptStaticEnumerator *)auStack_b8,&local_3c,
                                (PropertyAttributes *)0x0);
              } while (propertyString != (JavascriptString *)0x0);
            }
          }
        }
        else {
          ReadProxy(this,proxyObject,(JSONObject *)this_01,(JSONObjectStack *)auStack_68);
        }
      }
      else {
        auStack_b8 = (undefined1  [8])pSVar2;
        data.typeinfo = (type_info *)pSVar2;
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        while( true ) {
          if (data.typeinfo == (type_info *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                        ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar6) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar9 = 0;
          }
          auVar4 = auStack_b8;
          pSVar2 = *(ScriptContext **)data.typeinfo;
          Memory::Recycler::WBSetBit((char *)&stack0xffffffffffffffc8);
          pSStack_38 = pSVar2;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&stack0xffffffffffffffc8);
          if ((undefined1  [8])pSStack_38 == auVar4) break;
          pSVar2 = *(ScriptContext **)data.typeinfo;
          Memory::Recycler::WBSetBit((char *)&stack0xffffffffffffffc8);
          pSStack_38 = pSVar2;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&stack0xffffffffffffffc8);
          data.typeinfo = (type_info *)pSStack_38;
          pTVar10 = SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>
                    ::Iterator::Data((Iterator *)auStack_b8);
          ReadObjectElement(this,(pTVar10->propertyName).ptr,(pTVar10->propertyRecord).ptr,obj,
                            (JSONObject *)this_01,(JSONObjectStack *)auStack_68);
        }
        data.typeinfo = (type_info *)0x0;
      }
      SListBase<Js::JSONObjectProperty,_Memory::Recycler,_RealCount>::Reverse(this_01);
      cVar5 = stack.next._4_4_;
      CalculateStringifiedLength(this,(this_01->super_RealCount).count,stack.next._4_4_);
      this->indentLength = cVar5;
      return (JSONObject *)this_01;
    }
  }
  JavascriptError::ThrowTypeError(this->scriptContext,-0x7ff5ec56,(PCWSTR)0x0);
}

Assistant:

JSONObject*
JSONStringifier::ReadObject(_In_ RecyclableObject* obj, _In_ JSONObjectStack* objectStack)
{
    if (objectStack->Has(obj))
    {
        JavascriptError::ThrowTypeError(this->scriptContext, JSERR_JSONSerializeCircular);
    }
    JSONObjectStack stack = { 0 };
    stack.next = objectStack;
    stack.object = obj;

    // Increase indentation
    const charcount_t stepbackLength = this->indentLength;
    if (this->gapLength != 0)
    {
        this->indentLength = UInt32Math::Add(this->indentLength, this->gapLength);
    }

    Recycler* recycler = this->scriptContext->GetRecycler();
    JSONObject* jsonObject = RecyclerNew(recycler, JSONObject, recycler);

    // If we are given a property list, we should only read the listed properties
    if (this->propertyList != nullptr)
    {
        FOREACH_SLIST_ENTRY(PropertyListElement, entry, this->propertyList)
        {
            this->ReadObjectElement(entry.propertyName, entry.propertyRecord, obj, jsonObject, &stack);
        }
        NEXT_SLIST_ENTRY;
    }
    else
    {
        // Enumerating proxies is different than normal objects, so enumerate them separately
        JavascriptProxy* proxyObject = JavascriptOperators::TryFromVar<JavascriptProxy>(obj);
        if (proxyObject != nullptr)
        {
            this->ReadProxy(proxyObject, jsonObject, &stack);
        }
        else
        {
            JavascriptStaticEnumerator enumerator;
            EnumeratorCache* cache = this->scriptContext->GetLibrary()->GetStringifyCache(obj->GetType());
            if (obj->GetEnumerator(&enumerator, EnumeratorFlags::SnapShotSemantics | EnumeratorFlags::EphemeralReference | EnumeratorFlags::UseCache, this->scriptContext, cache))
            {
                JavascriptString* propertyName = nullptr;
                PropertyId nextKey = Constants::NoProperty;
                while ((propertyName = enumerator.MoveAndGetNext(nextKey)) != nullptr)
                {
                    const uint32 numericIndex = enumerator.GetCurrentItemIndex();
                    if (numericIndex != Constants::InvalidSourceIndex)
                    {
                        this->ReadObjectElement(propertyName, numericIndex, obj, jsonObject, &stack);
                    }
                    else
                    {
                        PropertyRecord const * propertyRecord = nullptr;
                        if (nextKey == Constants::NoProperty)
                        {
                            this->scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
                            nextKey = propertyRecord->GetPropertyId();
                        }
                        this->ReadObjectElement(propertyName, propertyRecord, obj, jsonObject, &stack);
                    }
                }
            }
        }
    }
    // JSONObject is an SList, which only has push/pop, so need to reverse list for it to be in order
    jsonObject->Reverse();
    const uint propertyCount = jsonObject->Count();

    this->CalculateStringifiedLength(propertyCount, stepbackLength);

    // Restore indent level
    this->indentLength = stepbackLength;

    return jsonObject;
}